

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

double __thiscall AddrInfo::GetChance(AddrInfo *this,NodeSeconds now)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  int *piVar4;
  duration<long,_std::ratio<60L,_1L>_> *in_RDI;
  long in_FS_OFFSET;
  double dVar5;
  double fChance;
  __unspec *in_stack_ffffffffffffffa8;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  double local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 1.0;
  std::chrono::operator-
            (in_stack_ffffffffffffffb0,
             (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_ffffffffffffffa8);
  min<(char)49,(char)48>();
  sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<60L,_1L>_>
                    ((duration<long,_std::ratio<1L,_1L>_> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_RDI);
  std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffffa8,(__unspec *)0x87db76);
  bVar3 = std::operator<(sVar2._M_value);
  if (bVar3) {
    local_38 = 0.01;
  }
  piVar4 = std::min<int>((int *)in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8);
  dVar5 = pow(0.66,(double)*piVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_38 * dVar5;
}

Assistant:

double AddrInfo::GetChance(NodeSeconds now) const
{
    double fChance = 1.0;

    // deprioritize very recent attempts away
    if (now - m_last_try < 10min) {
        fChance *= 0.01;
    }

    // deprioritize 66% after each failed attempt, but at most 1/28th to avoid the search taking forever or overly penalizing outages.
    fChance *= pow(0.66, std::min(nAttempts, 8));

    return fChance;
}